

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void spell_empathy(int level,int sn,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  CHAR_DATA *vict;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  if (in_RDX == in_RCX) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = is_affected(in_RCX,(int)gsn_empathy);
    if (bVar1) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
      init_affect((AFFECT_DATA *)0x767552);
      affect_to_char(in_RCX,in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

void spell_empathy(int level, int sn, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *vict = (CHAR_DATA *)vo;

	if (ch == vict)
	{
		send_to_char("You can not commune this on yourself.\n\r", ch);
		return;
	}

	if (is_affected(vict, gsn_empathy))
	{
		send_to_char("They are already being empathized with.\n\r", ch);
		return;
	}

	act("You touch your hand to $N's forehead and form a spiritual link.", ch, 0, vict, TO_CHAR);
	act("$n touches $s hand to your forehead and forms a spiritual link.", ch, 0, vict, TO_VICT);
	act("$n touches $N on $S forehead forming a spiritual link.", ch, 0, vict, TO_ROOM);

	init_affect(&af);
	af.owner = ch;
	af.level = ch->level;
	af.type = gsn_empathy;
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = 12;
	af.end_fun = empathy_end;
	affect_to_char(vict, &af);
}